

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall SQCompilation::CodegenVisitor::visitTerExpr(CodegenVisitor *this,TerExpr *expr)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  Node *pNVar5;
  SQFuncState *this_00;
  undefined2 uVar6;
  SQInteger SVar7;
  SQInteger SVar8;
  ulong pos;
  ulong pos_00;
  SQInstruction local_38;
  
  maybeAddInExprLine(this,&expr->super_Expr);
  pNVar5 = &expr->_a->super_Node;
  bVar1 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(pNVar5,this);
  this->_donot_get = bVar1;
  this_00 = this->_fs;
  SVar7 = SQFuncState::PopTarget(this_00);
  local_38._arg0 = (uchar)SVar7;
  local_38._0_5_ = 0x2700000000;
  local_38 = (SQInstruction)((ulong)local_38._4_2_ << 0x20);
  SQFuncState::AddInstruction(this_00,&local_38);
  sVar2 = (this->_fs->_instructions)._size;
  SVar7 = SQFuncState::PushTarget(this->_fs,-1);
  pNVar5 = &expr->_b->super_Node;
  bVar1 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(pNVar5,this);
  this->_donot_get = bVar1;
  SVar8 = SQFuncState::PopTarget(this->_fs);
  if (SVar7 != SVar8) {
    local_38._arg0 = (uchar)SVar7;
    local_38._0_5_ = 0xa00000000;
    uVar6 = local_38._4_2_;
    local_38.op = (char)uVar6;
    local_38._arg0 = (char)((ushort)uVar6 >> 8);
    local_38.field_0._arg1 = (int)SVar8;
    local_38._arg2 = '\0';
    local_38._arg3 = '\0';
    SQFuncState::AddInstruction(this->_fs,&local_38);
  }
  sVar3 = (this->_fs->_instructions)._size;
  local_38.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0x0;
  local_38.op = '\"';
  local_38._arg0 = '\0';
  local_38._arg2 = '\0';
  local_38._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_38);
  sVar4 = (this->_fs->_instructions)._size;
  pNVar5 = &expr->_c->super_Node;
  bVar1 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(pNVar5,this);
  this->_donot_get = bVar1;
  SVar8 = SQFuncState::PopTarget(this->_fs);
  if (SVar7 != SVar8) {
    local_38._arg0 = (uchar)SVar7;
    local_38._0_5_ = 0xa00000000;
    uVar6 = local_38._4_2_;
    local_38.op = (char)uVar6;
    local_38._arg0 = (char)((ushort)uVar6 >> 8);
    local_38.field_0._arg1 = (int)SVar8;
    local_38._arg2 = '\0';
    local_38._arg3 = '\0';
    SQFuncState::AddInstruction(this->_fs,&local_38);
  }
  pos = (ulong)(sVar4 - 1);
  pos_00 = (ulong)(sVar2 - 1);
  SQFuncState::SetInstructionParam(this->_fs,pos,1,((this->_fs->_instructions)._size - 1) - pos);
  SQFuncState::SetInstructionParam(this->_fs,pos_00,1,((sVar3 - 1) - pos_00) + 1);
  this->_fs->_optimization = false;
  return;
}

Assistant:

void CodegenVisitor::visitTerExpr(TerExpr *expr) {
    maybeAddInExprLine(expr);
    assert(expr->op() == TO_TERNARY);

    visitForceGet(expr->a());
    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jzpos = _fs->GetCurrentPos();

    SQInteger trg = _fs->PushTarget();
    visitForceGet(expr->b());
    SQInteger first_exp = _fs->PopTarget();
    if (trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
    SQInteger endfirstexp = _fs->GetCurrentPos();
    _fs->AddInstruction(_OP_JMP, 0, 0);
    SQInteger jmppos = _fs->GetCurrentPos();

    visitForceGet(expr->c());
    SQInteger second_exp = _fs->PopTarget();
    if (trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);

    _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    _fs->SetInstructionParam(jzpos, 1, endfirstexp - jzpos + 1);
    _fs->SnoozeOpt();
}